

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

ExportedTableInfo *
duckdb::ExportedTableInfo::Deserialize
          (ExportedTableInfo *__return_storage_ptr__,Deserializer *deserializer)

{
  ClientContext *context;
  ExportedTableData table_data;
  undefined1 local_140 [152];
  undefined1 local_a8 [152];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,1,"table_data");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  ExportedTableData::Deserialize((ExportedTableData *)local_140,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  ExportedTableData::ExportedTableData((ExportedTableData *)local_a8,(ExportedTableData *)local_140)
  ;
  ExportedTableInfo(__return_storage_ptr__,context,(ExportedTableData *)local_a8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_a8 + 0x80));
  if ((undefined1 *)local_a8._96_8_ != local_a8 + 0x70) {
    operator_delete((void *)local_a8._96_8_);
  }
  if ((undefined1 *)local_a8._64_8_ != local_a8 + 0x50) {
    operator_delete((void *)local_a8._64_8_);
  }
  if ((undefined1 *)local_a8._32_8_ != local_a8 + 0x30) {
    operator_delete((void *)local_a8._32_8_);
  }
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_140 + 0x80));
  if ((undefined1 *)local_140._96_8_ != local_140 + 0x70) {
    operator_delete((void *)local_140._96_8_);
  }
  if ((undefined1 *)local_140._64_8_ != local_140 + 0x50) {
    operator_delete((void *)local_140._64_8_);
  }
  if ((undefined1 *)local_140._32_8_ != local_140 + 0x30) {
    operator_delete((void *)local_140._32_8_);
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

ExportedTableInfo ExportedTableInfo::Deserialize(Deserializer &deserializer) {
	auto table_data = deserializer.ReadProperty<ExportedTableData>(1, "table_data");
	ExportedTableInfo result(deserializer.Get<ClientContext &>(), table_data);
	return result;
}